

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.cxx
# Opt level: O3

void __thiscall
cmExportTryCompileFileGenerator::PopulateProperties
          (cmExportTryCompileFileGenerator *this,cmGeneratorTarget *target,
          ImportPropertyMap *properties,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *emitted)

{
  pointer *pppcVar1;
  char *pcVar2;
  iterator __position;
  char *__s;
  mapped_type *pmVar3;
  long lVar4;
  cmLocalGenerator *this_00;
  pointer name;
  pointer prop;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar5;
  cmGeneratorTarget *tgt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string evalResult;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  cmGeneratorTarget *local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  ImportPropertyMap *local_78;
  vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *local_70;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_78 = properties;
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_48,target);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_70 = (vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *)
               &this->Exports;
    prop = local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      __s = cmGeneratorTarget::GetProperty(target,prop);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](local_78,prop);
      pcVar2 = (char *)pmVar3->_M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)pmVar3,0,pcVar2,(ulong)__s);
      lVar4 = std::__cxx11::string::find((char *)prop,0x50f057,0);
      if (lVar4 == 0) {
LAB_003aee1b:
        FindTargets(&local_68,this,prop,target,emitted);
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmSystemTools::ExpandListArgument(&local_68,&local_98,false);
        for (name = local_98.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
            name != local_98.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; name = name + 1) {
          this_00 = cmGeneratorTarget::GetLocalGenerator(target);
          local_a0 = cmLocalGenerator::FindGeneratorTargetToUse(this_00,name);
          if (local_a0 != (cmGeneratorTarget *)0x0) {
            pVar5 = std::
                    _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                    ::_M_insert_unique<cmGeneratorTarget_const*const&>
                              ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                                *)emitted,&local_a0);
            if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              __position._M_current =
                   (this->Exports).
                   super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->Exports).
                  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
                _M_realloc_insert<cmGeneratorTarget_const*const&>(local_70,__position,&local_a0);
              }
              else {
                *__position._M_current = local_a0;
                pppcVar1 = &(this->Exports).
                            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                *pppcVar1 = *pppcVar1 + 1;
              }
            }
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        lVar4 = std::__cxx11::string::find((char *)prop,0x51f2ef,0);
        if (lVar4 == 0) goto LAB_003aee1b;
        lVar4 = std::__cxx11::string::find((char *)prop,0x5013a3,0);
        if (lVar4 == 0) goto LAB_003aee1b;
      }
      prop = prop + 1;
    } while (prop != local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void
cmExportTryCompileFileGenerator::PopulateProperties(
                                 const cmGeneratorTarget* target,
                                 ImportPropertyMap& properties,
                                 std::set<cmGeneratorTarget const*> &emitted)
{
  std::vector<std::string> props = target->GetPropertyKeys();
  for(std::vector<std::string>::const_iterator i = props.begin();
      i != props.end(); ++i)
    {

    properties[*i] = target->GetProperty(*i);

    if(i->find("IMPORTED_LINK_INTERFACE_LIBRARIES") == 0
        || i->find("IMPORTED_LINK_DEPENDENT_LIBRARIES") == 0
        || i->find("INTERFACE_LINK_LIBRARIES") == 0)
      {
      std::string evalResult = this->FindTargets(*i,
                                                 target, emitted);

      std::vector<std::string> depends;
      cmSystemTools::ExpandListArgument(evalResult, depends);
      for(std::vector<std::string>::const_iterator li = depends.begin();
          li != depends.end(); ++li)
        {
        cmGeneratorTarget *tgt =
            target->GetLocalGenerator()->FindGeneratorTargetToUse(*li);
        if(tgt && emitted.insert(tgt).second)
          {
          this->Exports.push_back(tgt);
          }
        }
      }
    }
}